

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM
          (ChElementBeamTaperedTimoshenkoFPM *this,ShapeFunctionGroupFPM *NB,double eta)

{
  type __src;
  undefined1 auVar1 [32];
  ulong uVar2;
  ShapeFunctionGroupFPM *__dest;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *pCVar3;
  long lVar4;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_> *pCVar5;
  char *__function;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  DstEvaluatorType dstEvaluator;
  double k24;
  double k23;
  double k22;
  double L;
  SrcEvaluatorType srcEvaluator;
  double LL;
  double LLL;
  ChMatrixNM<double,_6,_12> Bx;
  ChMatrixNM<double,_6,_6> TNtemp;
  ChMatrixNM<double,_6,_6> Klaw_point;
  ChMatrixNM<double,_6,_12> Nx;
  ChMatrixNM<double,_6,_14> Ax;
  ChMatrixNM<double,_6,_14> dAx;
  ChMatrixNM<double,_14,_14> Ex;
  ChMatrixNM<double,_14,_14> Ex_inv;
  plainobjectbase_evaluator_data<double,_12> local_1f88;
  Scalar local_1f80;
  Scalar local_1f78;
  DstEvaluatorType *local_1f70;
  Scalar local_1f68;
  Scalar local_1f60;
  Scalar local_1f58;
  Scalar local_1f50;
  DstEvaluatorType *local_1f48;
  ChElementBeamTaperedTimoshenkoFPM *local_1f40;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *local_1f38;
  PointerType local_1f30;
  Scalar local_1f28;
  Scalar local_1f20;
  ChElementBeamTaperedTimoshenkoFPM *local_1f18;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *local_1f10;
  Scalar local_1f08;
  DstEvaluatorType *local_1f00;
  PointerType local_1ef8;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_1ee0;
  double local_1ec0;
  SrcEvaluatorType local_1eb8;
  ChElementBeamTaperedTimoshenkoFPM *local_1e90;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *local_1e88;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *local_1e80;
  DstEvaluatorType *local_1e78;
  undefined8 local_1e70;
  undefined8 uStack_1e68;
  ShapeFunctionGroupFPM *local_1e60;
  double local_1e58;
  double local_1e50;
  double local_1e48;
  undefined1 local_1e40 [32];
  double dStack_1e20;
  double dStack_1e18;
  double dStack_1e10;
  double dStack_1e08;
  double local_1e00;
  double dStack_1df8;
  double dStack_1df0;
  double dStack_1de8;
  double dStack_1de0;
  double dStack_1dd8;
  double dStack_1dd0;
  double dStack_1dc8;
  double local_1dc0;
  double dStack_1db8;
  double dStack_1db0;
  double dStack_1da8;
  double dStack_1da0;
  double dStack_1d98;
  double dStack_1d90;
  double dStack_1d88;
  double local_1d80;
  double dStack_1d78;
  double dStack_1d70;
  double dStack_1d68;
  double dStack_1d60;
  double dStack_1d58;
  double dStack_1d50;
  double dStack_1d48;
  double local_1d40;
  double dStack_1d38;
  double dStack_1d30;
  double dStack_1d28;
  double dStack_1d20;
  double dStack_1d18;
  double dStack_1d10;
  double dStack_1d08;
  double local_1d00;
  double dStack_1cf8;
  double dStack_1cf0;
  double dStack_1ce8;
  double dStack_1ce0;
  double dStack_1cd8;
  double dStack_1cd0;
  double dStack_1cc8;
  double local_1cc0;
  double dStack_1cb8;
  double dStack_1cb0;
  double dStack_1ca8;
  double dStack_1ca0;
  double dStack_1c98;
  double dStack_1c90;
  double dStack_1c88;
  double local_1c80;
  double dStack_1c78;
  double dStack_1c70;
  double dStack_1c68;
  double dStack_1c60;
  double dStack_1c58;
  double dStack_1c50;
  double dStack_1c48;
  double local_1c40;
  double dStack_1c38;
  double dStack_1c30;
  double dStack_1c28;
  double dStack_1c20;
  double dStack_1c18;
  double dStack_1c10;
  double dStack_1c08;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_> local_1c00;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 uStack_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 uStack_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  double local_1ab0;
  ulong uStack_1aa8;
  ChMatrixNM<double,_6,_6> local_1aa0;
  undefined1 local_1980 [1352];
  double dStack_1438;
  XprTypeNested pMStack_1430;
  double dStack_1428;
  double dStack_1420;
  double dStack_1418;
  double dStack_1410;
  double dStack_1408;
  double local_1400;
  double dStack_13f8;
  double dStack_13f0;
  double dStack_13e8;
  double dStack_13e0;
  double dStack_13d8;
  double dStack_13d0;
  double dStack_13c8;
  double local_13c0;
  double dStack_13b8;
  double dStack_13b0;
  double dStack_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double dStack_1388;
  double local_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  double dStack_1360;
  double dStack_1358;
  double dStack_1350;
  double dStack_1348;
  double local_1340;
  double dStack_1338;
  double dStack_1330;
  double dStack_1328;
  double dStack_1320;
  double dStack_1318;
  double dStack_1310;
  double dStack_1308;
  double local_1300;
  double dStack_12f8;
  double dStack_12f0;
  double dStack_12e8;
  double dStack_12e0;
  double dStack_12d8;
  double dStack_12d0;
  double dStack_12c8;
  double local_12c0;
  double dStack_12b8;
  double dStack_12b0;
  double dStack_12a8;
  double dStack_12a0;
  double dStack_1298;
  double dStack_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  double dStack_1270;
  double dStack_1268;
  double dStack_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double dStack_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> local_1200 [2];
  XprTypeNested local_1190 [14];
  XprTypeNested local_1120 [14];
  XprTypeNested local_10b0 [14];
  XprTypeNested local_1040 [14];
  XprTypeNested local_fd0 [14];
  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> local_f60 [2];
  XprTypeNested local_ef0 [14];
  XprTypeNested local_e80 [14];
  XprTypeNested local_e10 [14];
  XprTypeNested local_da0 [14];
  XprTypeNested local_d30 [14];
  undefined1 local_cc0 [224];
  undefined1 local_be0 [224];
  undefined1 local_b00 [224];
  undefined1 local_a20 [224];
  undefined1 local_940 [224];
  undefined1 local_860 [224];
  undefined1 local_780 [224];
  Matrix<double,_14,_14,_1,_14,_14> local_6a0;
  
  dStack_1e20 = (double)local_1e40._24_8_;
  local_1f30 = (PointerType)(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.length;
  local_1ef0 = (PointerType)((eta + 1.0) * 0.5);
  local_1f10 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                *)((double)local_1f30 * (double)local_1f30);
  local_1f00 = (DstEvaluatorType *)((double)local_1f30 * (double)local_1f10);
  local_1ef8 = local_1f30;
  local_1ec0 = eta;
  local_1e80 = local_1f10;
  local_1e78 = local_1f00;
  local_1e70 = this;
  memset(local_1200,0,0x2a0);
  memset(local_f60,0,0x2a0);
  memset(local_cc0,0,0x620);
  memset(&local_6a0,0,0x620);
  memset(local_1980 + 0x540,0,0x240);
  local_1e40._0_8_ = local_1980;
  local_1980._24_8_ = 0;
  local_1980._32_8_ = 0;
  local_1980._40_8_ = 6.91691904177745e-323;
  local_1e40._8_8_ = 0.0;
  local_1e40._16_8_ = (XprTypeNested)0x1;
  local_1e40._24_8_ = 1;
  local_1200[0].super_BlockImpl<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_Eigen::Dense>
  .super_BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>,_0>.m_data =
       (PointerType)((double)local_1ef0 * (double)local_1f30);
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 1.0;
  local_1980._0_8_ = local_1200;
  local_1980._16_8_ = local_1200;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_1e40,(Scalar *)&local_1aa0);
  local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1c00);
  local_1eb8.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs = (type)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1eb8);
  local_1ee0.m_dst = (DstEvaluatorType *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1ee0);
  local_1f88.data = (double *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1f88);
  local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1f38);
  local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1f40);
  local_1f48 = (DstEvaluatorType *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1f48);
  local_1f80 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_1f80);
  local_1f60 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_1f60);
  local_1f68 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_1f68);
  local_1f70 = (DstEvaluatorType *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_1f70);
  local_1f78 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,&local_1f78);
  if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
     ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
    local_1980._0_8_ =
         &local_1200[2].
          super_BlockImpl<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>.m_xpr;
    local_1980._16_8_ = local_1200;
    local_1980._24_8_ = 1;
    local_1980._32_8_ = 0;
    local_1e40._8_8_ = 0.0;
    local_1e40._16_8_ = (XprTypeNested)0x1;
    local_1980._40_8_ = 6.91691904177745e-323;
    local_1e40._24_8_ = 1;
    local_1190[0] = (XprTypeNested)0x0;
    local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1f18 = (ChElementBeamTaperedTimoshenkoFPM *)((double)local_1ef0 * (double)local_1ef0);
    local_1f30 = (PointerType)((double)local_1ef0 * (double)local_1f18);
    local_1e60 = NB;
    local_1e40._0_8_ = (XprTypeNested)local_1980;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                        *)local_1e40,(Scalar *)&local_1aa0);
    local_1e88 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                  *)((double)local_1f30 * (double)local_1f00);
    local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_1e88;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1c00);
    local_1eb8.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs = (type)((double)local_1f18 * (double)local_1f10);
    local_1e90 = (ChElementBeamTaperedTimoshenkoFPM *)
                 local_1eb8.
                 super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1eb8);
    local_1f30 = local_1ef8;
    local_1f00 = (DstEvaluatorType *)((double)local_1ef8 * (double)local_1ef0);
    local_1ee0.m_dst = local_1f00;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1ee0);
    local_1f88.data = (double *)0x3ff0000000000000;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1f88);
    local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                  *)0x0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1f38);
    local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1f40);
    local_1f48 = (DstEvaluatorType *)0x0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1f48);
    local_1f80 = 0.0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,&local_1f80);
    local_1f60 = 0.0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,&local_1f60);
    local_1f68 = 0.0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,&local_1f68);
    local_1f70 = (DstEvaluatorType *)0x0;
    pCVar3 = Eigen::
             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
             operator_(pCVar3,(Scalar *)&local_1f70);
    local_1f78 = 0.0;
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
    operator_(pCVar3,&local_1f78);
    if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
       ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
      local_1980._0_8_ = local_1120;
      local_1980._16_8_ = local_1200;
      local_1980._24_8_ = 2;
      local_1980._32_8_ = 0;
      local_1e40._8_8_ = 0.0;
      local_1e40._16_8_ = (XprTypeNested)0x1;
      local_1980._40_8_ = 6.91691904177745e-323;
      local_1e40._24_8_ = 1;
      local_1120[0] = (XprTypeNested)0x0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
      [0] = 0.0;
      local_1e40._0_8_ = (XprTypeNested)local_1980;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                            *)local_1e40,(Scalar *)&local_1aa0);
      local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1c00);
      local_1eb8.
      super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_lhs = (type)0x0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1eb8);
      local_1ee0.m_dst = (DstEvaluatorType *)0x0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1ee0);
      local_1f88.data = (double *)0x0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1f88);
      local_1f38 = local_1e88;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1f38);
      local_1f40 = local_1e90;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1f40);
      local_1f48 = local_1f00;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1f48);
      local_1f80 = 1.0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,&local_1f80);
      local_1f60 = 0.0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,&local_1f60);
      local_1f68 = 0.0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,&local_1f68);
      local_1f70 = (DstEvaluatorType *)0x0;
      pCVar3 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
               ::operator_(pCVar3,(Scalar *)&local_1f70);
      local_1f78 = 0.0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
      operator_(pCVar3,&local_1f78);
      if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
         ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
        local_1980._0_8_ = local_1120 + 0xe;
        local_1980._16_8_ = local_1200;
        local_1980._24_8_ = 3;
        local_1980._32_8_ = 0;
        local_1e40._8_8_ = 0.0;
        local_1e40._16_8_ = (XprTypeNested)0x1;
        local_1980._40_8_ = 6.91691904177745e-323;
        local_1e40._24_8_ = 1;
        local_10b0[0] = (XprTypeNested)0x0;
        local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
        array[0] = 0.0;
        local_1e40._0_8_ = (XprTypeNested)local_1980;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                              *)local_1e40,(Scalar *)&local_1aa0);
        local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1c00);
        local_1eb8.
        super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs = (type)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1eb8);
        local_1ee0.m_dst = (DstEvaluatorType *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1ee0);
        local_1f88.data = (double *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1f88);
        local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1f38);
        local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1f40);
        local_1f48 = (DstEvaluatorType *)0x0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1f48);
        local_1f80 = 0.0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,&local_1f80);
        local_1f60 = 0.0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,&local_1f60);
        local_1f68 = 0.0;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,&local_1f68);
        local_1f70 = local_1f00;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                 ::operator_(pCVar3,(Scalar *)&local_1f70);
        local_1f78 = 1.0;
        Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
        ::operator_(pCVar3,&local_1f78);
        if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
           ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
          local_1980._0_8_ = local_1040;
          local_1980._16_8_ = local_1200;
          local_1980._24_8_ = 4;
          local_1980._32_8_ = 0;
          local_1e40._8_8_ = 0.0;
          local_1e40._16_8_ = (XprTypeNested)0x1;
          local_1980._40_8_ = 6.91691904177745e-323;
          local_1e40._24_8_ = 1;
          local_1040[0] = (XprTypeNested)0x0;
          local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0] = 0.0;
          local_1e40._0_8_ = (XprTypeNested)local_1980;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                *)local_1e40,(Scalar *)&local_1aa0);
          local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1c00);
          local_1eb8.
          super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs = (type)0x0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1eb8);
          local_1ee0.m_dst = (DstEvaluatorType *)0x0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1ee0);
          local_1f88.data = (double *)0x0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1f88);
          local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                        *)((double)local_1f10 * -3.0 * (double)local_1f18);
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1f38);
          local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)
                       ((double)local_1f30 * -2.0 * (double)local_1ef0);
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1f40);
          local_1f48 = (DstEvaluatorType *)0xbff0000000000000;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1f48);
          local_1f80 = 0.0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,&local_1f80);
          local_1f60 = 1.0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,&local_1f60);
          local_1f68 = 0.0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,&local_1f68);
          local_1f70 = (DstEvaluatorType *)0x0;
          pCVar3 = Eigen::
                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                   ::operator_(pCVar3,(Scalar *)&local_1f70);
          local_1f78 = 0.0;
          Eigen::
          CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
          operator_(pCVar3,&local_1f78);
          if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
             ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
            local_1980._0_8_ = local_1040 + 0xe;
            local_1980._16_8_ = local_1200;
            local_1980._24_8_ = 5;
            local_1980._32_8_ = 0;
            local_1e40._8_8_ = 0.0;
            local_1e40._16_8_ = (XprTypeNested)0x1;
            local_1980._40_8_ = 6.91691904177745e-323;
            local_1e40._24_8_ = 1;
            local_fd0[0] = (XprTypeNested)0x0;
            local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
            .array[0] = 0.0;
            local_1e40._0_8_ = (XprTypeNested)local_1980;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                  *)local_1e40,(Scalar *)&local_1aa0);
            local_1f10 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                          *)((double)local_1f10 * 3.0 * (double)local_1f18);
            local_1c00.m_xpr =
                 (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_1f10;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1c00);
            local_1f18 = (ChElementBeamTaperedTimoshenkoFPM *)
                         (((double)local_1f30 + (double)local_1f30) * (double)local_1ef0);
            local_1eb8.
            super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs = (type)local_1f18;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1eb8);
            local_1ee0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1ee0);
            local_1f88.data = (double *)0x0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1f88);
            local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                          *)0x0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1f38);
            local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1f40);
            local_1f48 = (DstEvaluatorType *)0x0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1f48);
            local_1f80 = 0.0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,&local_1f80);
            local_1f60 = 0.0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,&local_1f60);
            local_1f68 = -1.0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,&local_1f68);
            local_1f70 = (DstEvaluatorType *)0x0;
            pCVar3 = Eigen::
                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                     ::operator_(pCVar3,(Scalar *)&local_1f70);
            local_1f78 = 0.0;
            Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
            operator_(pCVar3,&local_1f78);
            if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
               ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
              local_1980._24_8_ = 0;
              local_1980._32_8_ = 0;
              local_1e40._8_8_ = 0.0;
              local_1e40._16_8_ = (XprTypeNested)0x1;
              local_1980._40_8_ = 6.91691904177745e-323;
              local_1e40._24_8_ = 1;
              local_f60[0].
              super_BlockImpl<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>,_0>.
              m_data = (PointerType)0x3ff0000000000000;
              local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[0] = 0.0;
              local_1e40._0_8_ = (XprTypeNested)local_1980;
              local_1980._0_8_ = local_f60;
              local_1980._16_8_ = local_f60;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                    *)local_1e40,(Scalar *)&local_1aa0);
              local_1c00.m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0
              ;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1c00);
              local_1eb8.
              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs = (type)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1eb8);
              local_1ee0.m_dst = (DstEvaluatorType *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1ee0);
              local_1f88.data = (double *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1f88);
              local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                            *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1f38);
              local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1f40);
              local_1f48 = (DstEvaluatorType *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1f48);
              local_1f80 = 0.0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,&local_1f80);
              local_1f60 = 0.0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,&local_1f60);
              local_1f68 = 0.0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,&local_1f68);
              local_1f70 = (DstEvaluatorType *)0x0;
              pCVar3 = Eigen::
                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                       ::operator_(pCVar3,(Scalar *)&local_1f70);
              local_1f78 = 0.0;
              Eigen::
              CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
              operator_(pCVar3,&local_1f78);
              if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                 ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                local_1980._0_8_ =
                     &local_f60[2].
                      super_BlockImpl<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>
                      .m_xpr;
                local_1e40._8_8_ = 0.0;
                local_ef0[0] = (XprTypeNested)0x0;
                local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                m_data.array[0] = 0.0;
                local_1980._24_8_ = 1;
                local_1980._32_8_ = 0;
                local_1e40._16_8_ = (XprTypeNested)0x1;
                local_1980._40_8_ = 6.91691904177745e-323;
                local_1e40._24_8_ = 1;
                local_1e40._0_8_ = (XprTypeNested)local_1980;
                local_1980._16_8_ = local_f60;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                      *)local_1e40,(Scalar *)&local_1aa0);
                local_1c00.m_xpr =
                     (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_1f10;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1c00);
                local_1eb8.
                super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs = (type)local_1f18;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1eb8);
                local_1ee0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1ee0);
                local_1f88.data = (double *)0x0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1f88);
                local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                              *)0x0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1f38);
                local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1f40);
                local_1f48 = (DstEvaluatorType *)0x0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1f48);
                local_1f80 = 0.0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,&local_1f80);
                local_1f60 = 0.0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,&local_1f60);
                local_1f68 = 0.0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,&local_1f68);
                local_1f70 = (DstEvaluatorType *)0x0;
                pCVar3 = Eigen::
                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                         ::operator_(pCVar3,(Scalar *)&local_1f70);
                local_1f78 = 0.0;
                Eigen::
                CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                ::operator_(pCVar3,&local_1f78);
                if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                   ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                  local_1980._0_8_ = local_e80;
                  local_1980._24_8_ = 2;
                  local_1980._32_8_ = 0;
                  local_1e40._8_8_ = 0.0;
                  local_1e40._16_8_ = (XprTypeNested)0x1;
                  local_1980._40_8_ = 6.91691904177745e-323;
                  local_1e40._24_8_ = 1;
                  local_e80[0] = (XprTypeNested)0x0;
                  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[0] = 0.0;
                  local_1e40._0_8_ = (XprTypeNested)local_1980;
                  local_1980._16_8_ = local_f60;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                        *)local_1e40,(Scalar *)&local_1aa0);
                  local_1c00.m_xpr =
                       (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1c00);
                  local_1eb8.
                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs = (type)0x0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1eb8);
                  local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1ee0);
                  local_1f88.data = (double *)0x0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1f88);
                  local_1f38 = local_1f10;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1f38);
                  local_1f40 = local_1f18;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1f40);
                  local_1f48 = (DstEvaluatorType *)0x3ff0000000000000;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1f48);
                  local_1f80 = 0.0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,&local_1f80);
                  local_1f60 = 0.0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,&local_1f60);
                  local_1f68 = 0.0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,&local_1f68);
                  local_1f70 = (DstEvaluatorType *)0x0;
                  pCVar3 = Eigen::
                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                           ::operator_(pCVar3,(Scalar *)&local_1f70);
                  local_1f78 = 0.0;
                  Eigen::
                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                  ::operator_(pCVar3,&local_1f78);
                  if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                     ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                    local_1980._0_8_ = local_e80 + 0xe;
                    local_1980._24_8_ = 3;
                    local_1980._32_8_ = 0;
                    local_1e40._8_8_ = 0.0;
                    local_1e40._16_8_ = (XprTypeNested)0x1;
                    local_1980._40_8_ = 6.91691904177745e-323;
                    local_1e40._24_8_ = 1;
                    local_e10[0] = (XprTypeNested)0x0;
                    local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                    m_storage.m_data.array[0] = 0.0;
                    local_1e40._0_8_ = (XprTypeNested)local_1980;
                    local_1980._16_8_ = local_f60;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                          *)local_1e40,(Scalar *)&local_1aa0);
                    local_1c00.m_xpr =
                         (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1c00);
                    local_1eb8.
                    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs = (type)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1eb8);
                    local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1ee0);
                    local_1f88.data = (double *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1f88);
                    local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                  *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1f38);
                    local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1f40);
                    local_1f48 = (DstEvaluatorType *)0x0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1f48);
                    local_1f80 = 0.0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,&local_1f80);
                    local_1f60 = 0.0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,&local_1f60);
                    local_1f68 = 0.0;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,&local_1f68);
                    local_1f70 = (DstEvaluatorType *)0x3ff0000000000000;
                    pCVar3 = Eigen::
                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                             ::operator_(pCVar3,(Scalar *)&local_1f70);
                    local_1f78 = 0.0;
                    Eigen::
                    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                    ::operator_(pCVar3,&local_1f78);
                    if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                       ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                      local_1980._0_8_ = local_da0;
                      local_1980._24_8_ = 4;
                      local_1980._32_8_ = 0;
                      local_1e40._8_8_ = 0.0;
                      local_1e40._16_8_ = (XprTypeNested)0x1;
                      local_1980._40_8_ = 6.91691904177745e-323;
                      local_1e40._24_8_ = 1;
                      local_da0[0] = (XprTypeNested)0x0;
                      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[0] = 0.0;
                      local_1e40._0_8_ = (XprTypeNested)local_1980;
                      local_1980._16_8_ = local_f60;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                            *)local_1e40,(Scalar *)&local_1aa0);
                      local_1c00.m_xpr =
                           (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1c00);
                      local_1eb8.
                      super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .m_lhs = (type)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1eb8);
                      local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1ee0);
                      local_1f88.data = (double *)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1f88);
                      local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                    *)((double)local_1f30 * -6.0 * (double)local_1ef0);
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1f38);
                      local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0xc000000000000000;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1f40);
                      local_1f48 = (DstEvaluatorType *)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1f48);
                      local_1f80 = 0.0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,&local_1f80);
                      local_1f60 = 0.0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,&local_1f60);
                      local_1f68 = 0.0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,&local_1f68);
                      local_1f70 = (DstEvaluatorType *)0x0;
                      pCVar3 = Eigen::
                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                               ::operator_(pCVar3,(Scalar *)&local_1f70);
                      local_1f78 = 0.0;
                      Eigen::
                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      ::operator_(pCVar3,&local_1f78);
                      if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                         ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                        local_1980._0_8_ = local_da0 + 0xe;
                        local_1980._24_8_ = 5;
                        local_1980._32_8_ = 0;
                        local_1e40._8_8_ = 0.0;
                        local_1e40._16_8_ = (XprTypeNested)0x1;
                        local_1980._40_8_ = 6.91691904177745e-323;
                        local_1e40._24_8_ = 1;
                        local_d30[0] = (XprTypeNested)0x0;
                        local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array[0] = 0.0;
                        local_1e40._0_8_ = (XprTypeNested)local_1980;
                        local_1980._16_8_ = local_f60;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                              *)local_1e40,(Scalar *)&local_1aa0);
                        local_1c00.m_xpr =
                             (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
                             ((double)local_1f30 * 6.0 * (double)local_1ef0);
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1c00);
                        local_1eb8.
                        super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs = (type)0x4000000000000000;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1eb8);
                        local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1ee0);
                        local_1f88.data = (double *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1f88);
                        local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                      *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1f38);
                        local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1f40);
                        local_1f48 = (DstEvaluatorType *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1f48);
                        local_1f80 = 0.0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,&local_1f80);
                        local_1f60 = 0.0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,&local_1f60);
                        local_1f68 = 0.0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,&local_1f68);
                        local_1f70 = (DstEvaluatorType *)0x0;
                        pCVar3 = Eigen::
                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                 ::operator_(pCVar3,(Scalar *)&local_1f70);
                        local_1f78 = 0.0;
                        Eigen::
                        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                        ::operator_(pCVar3,&local_1f78);
                        if ((local_1e40._24_8_ + local_1e40._8_8_ == 1) &&
                           ((XprTypeNested)local_1e40._16_8_ == (XprTypeNested)0xe)) {
                          memset(local_1980,0,0x540);
                          auVar30._8_8_ = 0x3ff0000000000000;
                          auVar30._0_8_ = 0x3ff0000000000000;
                          auVar30._16_8_ = 0x3ff0000000000000;
                          auVar30._24_8_ = 0x3ff0000000000000;
                          auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                          auVar21._8_8_ = 0xc;
                          auVar21._0_8_ = 0xc;
                          auVar21._16_8_ = 0xc;
                          auVar21._24_8_ = 0xc;
                          auVar29._8_8_ = 0x60;
                          auVar29._0_8_ = 0x60;
                          auVar29._16_8_ = 0x60;
                          auVar29._24_8_ = 0x60;
                          auVar31._8_8_ = 4;
                          auVar31._0_8_ = 4;
                          auVar31._16_8_ = 4;
                          auVar31._24_8_ = 4;
                          auVar6 = vpbroadcastq_avx512vl();
                          lVar4 = 0xc;
                          do {
                            auVar7 = vpmullq_avx512vl(auVar1,auVar29);
                            auVar32 = vpsllq_avx2(auVar1,3);
                            uVar2 = vpcmpuq_avx512vl(auVar1,auVar21,1);
                            auVar1 = vpaddq_avx2(auVar1,auVar31);
                            lVar4 = lVar4 + -4;
                            auVar32 = vpaddq_avx2(auVar6,auVar32);
                            auVar32 = vpaddq_avx2(auVar32,auVar7);
                            vscatterqpd_avx512vl(ZEXT832(0) + auVar32,uVar2 & 0xf,auVar30);
                          } while (lVar4 != 0);
                          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint
                                    (&local_1aa0,
                                     (local_1e70->tapered_section_fpm).
                                     super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,local_1ec0);
                          local_1eb8.
                          super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhs = (type)0x0;
                          local_1f38 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                        *)local_1aa0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[7];
                          local_1e50 = local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[1];
                          local_1ef0 = (PointerType)0x8000000000000000;
                          uStack_1ee8 = 0x8000000000000000;
                          local_1e70 = (ChElementBeamTaperedTimoshenkoFPM *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[8];
                          uStack_1e68 = 0;
                          local_1f40 = (ChElementBeamTaperedTimoshenkoFPM *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[8];
                          auVar8._8_4_ = 0;
                          auVar8._0_8_ = -local_1aa0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[2];
                          auVar8._12_4_ = 0x80000000;
                          local_cc0._0_8_ = vmovlps_avx(auVar8);
                          local_1f48 = (DstEvaluatorType *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[9];
                          local_1e88 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                        *)local_1aa0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[10];
                          local_1e90 = (ChElementBeamTaperedTimoshenkoFPM *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0xb];
                          local_1f10 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                                        *)local_1aa0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x10];
                          local_1f18 = (ChElementBeamTaperedTimoshenkoFPM *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0x11];
                          local_1e48 = local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0x1c];
                          local_1f00 = (DstEvaluatorType *)
                                       local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0x1d];
                          local_1e58 = local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0x23];
                          local_1ac0 = local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0xe];
                          uStack_1ab8 = 0;
                          local_1c00.m_row = 0;
                          local_1c00.m_col = 1;
                          local_1c00.m_currentBlockRows = 1;
                          local_1ab0 = local_1aa0.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                       m_storage.m_data.array[0xf];
                          uStack_1aa8 = 0;
                          register0x00001240 = ZEXT816(0) << 0x20;
                          dStack_1e18 = 6.91691904177745e-323;
                          local_1e40._0_8_ = (XprTypeNested)local_cc0;
                          local_1e40._16_8_ = (XprTypeNested)local_cc0;
                          local_1c00.m_xpr =
                               (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
                               local_1e40;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                          auVar22._8_8_ = 0;
                          auVar22._0_8_ = local_1f18;
                          auVar26._8_8_ = 0;
                          auVar26._0_8_ = local_1f00;
                          auVar17._8_8_ = 0;
                          auVar17._0_8_ = (double)local_1f18 * (double)local_1f30 * -3.0;
                          auVar8 = vfmadd231sd_fma(auVar17,auVar26,ZEXT816(0x4018000000000000));
                          auVar9._8_8_ = 0;
                          auVar9._0_8_ = (double)local_1f30 * -3.0 * local_1ec0;
                          auVar8 = vfmadd213sd_fma(auVar9,auVar22,auVar8);
                          local_1ee0.m_dst = auVar8._0_8_;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,(Scalar *)&local_1ee0);
                          local_1f88.data = (double *)((double)local_1f18 * -2.0);
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,(Scalar *)&local_1f88);
                          local_1f80 = 0.0;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f80);
                          local_1f60 = 0.0;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f60);
                          auVar23._8_8_ = 0;
                          auVar23._0_8_ = local_1f10;
                          auVar10._8_8_ = 0;
                          auVar10._0_8_ = (double)local_1f30 * 3.0;
                          auVar18._8_8_ = 0;
                          auVar18._0_8_ = local_1e48 * -6.0;
                          auVar8 = vfmadd231sd_fma(auVar18,auVar10,auVar23);
                          auVar11._8_8_ = 0;
                          auVar11._0_8_ = (double)local_1f30 * 3.0 * local_1ec0;
                          auVar8 = vfmadd213sd_fma(auVar11,auVar23,auVar8);
                          local_1f68 = auVar8._0_8_;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f68);
                          local_1f70 = (DstEvaluatorType *)((double)local_1f10 + (double)local_1f10)
                          ;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,(Scalar *)&local_1f70);
                          local_1f78 = 0.0;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f78);
                          local_1f50 = 0.0;
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f50);
                          auVar12._0_4_ = (uint)local_1ac0 ^ (uint)local_1ef0;
                          auVar12._4_4_ = local_1ac0._4_4_ ^ local_1ef0._4_4_;
                          auVar12._8_4_ = (uint)uStack_1ab8 ^ (uint)uStack_1ee8;
                          auVar12._12_4_ = uStack_1ab8._4_4_ ^ uStack_1ee8._4_4_;
                          local_1f58 = (Scalar)vmovlps_avx(auVar12);
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f58);
                          auVar13._0_4_ = (uint)local_1ef0 ^ (uint)local_1e70;
                          auVar13._4_4_ = local_1ef0._4_4_ ^ local_1e70._4_4_;
                          auVar13._8_4_ = (uint)uStack_1ee8 ^ (uint)uStack_1e68;
                          auVar13._12_4_ = uStack_1ee8._4_4_ ^ uStack_1e68._4_4_;
                          local_1f20 = (Scalar)vmovlps_avx(auVar13);
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f20);
                          auVar14._0_8_ = (ulong)local_1ef0 ^ (ulong)local_1ab0;
                          auVar14._8_8_ = uStack_1ee8 ^ uStack_1aa8;
                          local_1f28 = (Scalar)vmovlpd_avx(auVar14);
                          pCVar5 = Eigen::
                                   CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                   ::operator_(pCVar5,&local_1f28);
                          local_1f08 = 0.0;
                          Eigen::
                          CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                          ::operator_(pCVar5,&local_1f08);
                          if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                             (local_1c00.m_col == 0xe)) {
                            local_1e40._0_8_ = local_cc0 + 0x70;
                            local_1e40._16_8_ = local_cc0;
                            stack0xffffffffffffe1d8 = ZEXT816(1);
                            local_1c00.m_row = 0;
                            local_1c00.m_col = 1;
                            dStack_1e18 = 6.91691904177745e-323;
                            local_1c00.m_currentBlockRows = 1;
                            local_1eb8.
                            super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            .m_lhs = (type)0x0;
                            local_cc0._112_8_ = local_1e50;
                            local_1c00.m_xpr =
                                 (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
                                 local_1e40;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                            auVar27._8_8_ = 0;
                            auVar27._0_8_ = local_1e90;
                            auVar24._8_8_ = 0;
                            auVar24._0_8_ = local_1e58;
                            local_1ef0 = local_1ef8;
                            auVar19._8_8_ = 0;
                            auVar19._0_8_ = (double)local_1e90 * (double)local_1ef8 * 3.0;
                            auVar8 = vfmadd231sd_fma(auVar19,auVar24,ZEXT816(0x4018000000000000));
                            auVar15._8_8_ = 0;
                            auVar15._0_8_ = (double)local_1ef8 * 3.0 * local_1ec0;
                            auVar8 = vfmadd213sd_fma(auVar15,auVar27,auVar8);
                            local_1ee0.m_dst = auVar8._0_8_;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1ee0);
                            local_1f88.data = (double *)((double)local_1e90 + (double)local_1e90);
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1f88);
                            local_1f80 = 0.0;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,&local_1f80);
                            local_1f60 = 0.0;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,&local_1f60);
                            auVar28._8_8_ = 0;
                            auVar28._0_8_ = local_1e88;
                            auVar25._8_8_ = 0;
                            auVar25._0_8_ = local_1f00;
                            auVar20._8_8_ = 0;
                            auVar20._0_8_ = (double)local_1e88 * (double)local_1ef0 * -3.0;
                            auVar8 = vfmadd231sd_fma(auVar20,auVar25,ZEXT816(0xc018000000000000));
                            auVar16._8_8_ = 0;
                            auVar16._0_8_ = (double)local_1ef0 * -3.0 * local_1ec0;
                            auVar8 = vfmadd213sd_fma(auVar16,auVar28,auVar8);
                            local_1f68 = auVar8._0_8_;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,&local_1f68);
                            local_1f70 = (DstEvaluatorType *)((double)local_1e88 * -2.0);
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1f70);
                            local_1f78 = 0.0;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,&local_1f78);
                            local_1f50 = 0.0;
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,&local_1f50);
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1f40);
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1f38);
                            pCVar5 = Eigen::
                                     CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                     ::operator_(pCVar5,(Scalar *)&local_1f48);
                            local_1f58 = 0.0;
                            Eigen::
                            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                            ::operator_(pCVar5,&local_1f58);
                            if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                               (local_1c00.m_col == 0xe)) {
                              local_1e40._0_8_ = local_be0;
                              stack0xffffffffffffe1d8 = ZEXT816(2);
                              local_1c00.m_row = 0;
                              local_1c00.m_col = 1;
                              dStack_1e18 = 6.91691904177745e-323;
                              local_1c00.m_currentBlockRows = 1;
                              local_be0._0_8_ = (PointerType)0x0;
                              local_1eb8.
                              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              .m_lhs = (type)0x3ff0000000000000;
                              local_1e40._16_8_ = (XprTypeNested)local_cc0;
                              local_1c00.m_xpr =
                                   (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
                                   local_1e40;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                              local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,(Scalar *)&local_1ee0);
                              local_1f88.data = (double *)0x0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,(Scalar *)&local_1f88);
                              local_1f80 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f80);
                              local_1f60 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f60);
                              local_1f68 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f68);
                              local_1f70 = (DstEvaluatorType *)0x0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,(Scalar *)&local_1f70);
                              local_1f78 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f78);
                              local_1f50 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f50);
                              local_1f58 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f58);
                              local_1f20 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f20);
                              local_1f28 = 0.0;
                              pCVar5 = Eigen::
                                       CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                       ::operator_(pCVar5,&local_1f28);
                              local_1f08 = 0.0;
                              Eigen::
                              CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                              ::operator_(pCVar5,&local_1f08);
                              if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                                 (local_1c00.m_col == 0xe)) {
                                local_1e40._0_8_ = local_be0 + 0x70;
                                stack0xffffffffffffe1d8 = ZEXT816(3);
                                local_1c00.m_row = 0;
                                local_1c00.m_col = 1;
                                dStack_1e18 = 6.91691904177745e-323;
                                local_1c00.m_currentBlockRows = 1;
                                local_be0._112_8_ = 0.0;
                                local_1eb8.
                                super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                .m_lhs = (type)0x0;
                                local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                local_1c00.m_xpr =
                                     (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *
                                     )local_1e40;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                local_1f88.data = (double *)0x0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,(Scalar *)&local_1f88);
                                local_1f80 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f80);
                                local_1f60 = 1.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f60);
                                local_1f68 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f68);
                                local_1f70 = (DstEvaluatorType *)0x0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,(Scalar *)&local_1f70);
                                local_1f78 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f78);
                                local_1f50 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f50);
                                local_1f58 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f58);
                                local_1f20 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f20);
                                local_1f28 = 0.0;
                                pCVar5 = Eigen::
                                         CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                         ::operator_(pCVar5,&local_1f28);
                                local_1f08 = 0.0;
                                Eigen::
                                CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                ::operator_(pCVar5,&local_1f08);
                                if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                                   (local_1c00.m_col == 0xe)) {
                                  local_1e40._0_8_ = local_b00;
                                  stack0xffffffffffffe1d8 = ZEXT816(4);
                                  local_1c00.m_row = 0;
                                  local_1c00.m_col = 1;
                                  dStack_1e18 = 6.91691904177745e-323;
                                  local_1c00.m_currentBlockRows = 1;
                                  local_b00._0_8_ = (PointerType)0x0;
                                  local_1eb8.
                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                  .m_lhs = (type)0x0;
                                  local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                  local_1c00.m_xpr =
                                       (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                        *)local_1e40;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                  local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                  local_1f88.data = (double *)0x0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,(Scalar *)&local_1f88);
                                  local_1f80 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f80);
                                  local_1f60 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f60);
                                  local_1f68 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f68);
                                  local_1f70 = (DstEvaluatorType *)0x0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,(Scalar *)&local_1f70);
                                  local_1f78 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f78);
                                  local_1f50 = 1.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f50);
                                  local_1f58 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f58);
                                  local_1f20 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f20);
                                  local_1f28 = 0.0;
                                  pCVar5 = Eigen::
                                           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                           ::operator_(pCVar5,&local_1f28);
                                  local_1f08 = 0.0;
                                  Eigen::
                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                  ::operator_(pCVar5,&local_1f08);
                                  if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                                     (local_1c00.m_col == 0xe)) {
                                    local_1e40._0_8_ = local_b00 + 0x70;
                                    stack0xffffffffffffe1d8 = ZEXT816(5);
                                    local_1c00.m_row = 0;
                                    local_1c00.m_col = 1;
                                    dStack_1e18 = 6.91691904177745e-323;
                                    local_1c00.m_currentBlockRows = 1;
                                    local_b00._112_8_ = 0.0;
                                    local_1eb8.
                                    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                    .m_lhs = (type)0x0;
                                    local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                    local_1c00.m_xpr =
                                         (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                          *)local_1e40;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                    local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                    local_1f88.data = (double *)0x0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,(Scalar *)&local_1f88);
                                    local_1f80 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f80);
                                    local_1f60 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f60);
                                    local_1f68 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f68);
                                    local_1f70 = (DstEvaluatorType *)0x0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,(Scalar *)&local_1f70);
                                    local_1f78 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f78);
                                    local_1f50 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f50);
                                    local_1f58 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f58);
                                    local_1f20 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f20);
                                    local_1f28 = 0.0;
                                    pCVar5 = Eigen::
                                             CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                             ::operator_(pCVar5,&local_1f28);
                                    local_1f08 = 1.0;
                                    Eigen::
                                    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                    ::operator_(pCVar5,&local_1f08);
                                    if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                                       (local_1c00.m_col == 0xe)) {
                                      local_1e40._0_8_ = local_a20;
                                      stack0xffffffffffffe1d8 = ZEXT816(6);
                                      local_1c00.m_row = 0;
                                      local_1c00.m_col = 1;
                                      dStack_1e18 = 6.91691904177745e-323;
                                      local_1c00.m_currentBlockRows = 1;
                                      local_a20._0_8_ = (PointerType)0x0;
                                      local_1eb8.
                                      super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                      .m_lhs = (type)0x0;
                                      local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                      local_1c00.m_xpr =
                                           (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                            *)local_1e40;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                      local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                      local_1f88.data = (double *)0x0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,(Scalar *)&local_1f88);
                                      local_1f80 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f80);
                                      local_1f60 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f60);
                                      local_1f68 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f68);
                                      local_1f70 = (DstEvaluatorType *)0x0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,(Scalar *)&local_1f70);
                                      local_1f78 = -1.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f78);
                                      local_1f50 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f50);
                                      local_1f58 = 1.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f58);
                                      local_1f20 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f20);
                                      local_1f28 = 0.0;
                                      pCVar5 = Eigen::
                                               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                               ::operator_(pCVar5,&local_1f28);
                                      local_1f08 = 0.0;
                                      Eigen::
                                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                      ::operator_(pCVar5,&local_1f08);
                                      if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1) &&
                                         (local_1c00.m_col == 0xe)) {
                                        local_1e40._0_8_ = local_a20 + 0x70;
                                        stack0xffffffffffffe1d8 = ZEXT816(7);
                                        local_1c00.m_row = 0;
                                        local_1c00.m_col = 1;
                                        dStack_1e18 = 6.91691904177745e-323;
                                        local_1c00.m_currentBlockRows = 1;
                                        local_a20._112_8_ = 0.0;
                                        local_1eb8.
                                        super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                        .m_lhs = (type)0x0;
                                        local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                        local_1c00.m_xpr =
                                             (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                              *)local_1e40;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                        local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                        local_1f88.data = (double *)0x0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,(Scalar *)&local_1f88);
                                        local_1f80 = 1.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f80);
                                        local_1f60 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f60);
                                        local_1f68 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f68);
                                        local_1f70 = (DstEvaluatorType *)0x0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,(Scalar *)&local_1f70);
                                        local_1f78 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f78);
                                        local_1f50 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f50);
                                        local_1f58 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f58);
                                        local_1f20 = -1.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f20);
                                        local_1f28 = 0.0;
                                        pCVar5 = Eigen::
                                                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                 ::operator_(pCVar5,&local_1f28);
                                        local_1f08 = 0.0;
                                        Eigen::
                                        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                        ::operator_(pCVar5,&local_1f08);
                                        if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1)
                                           && (local_1c00.m_col == 0xe)) {
                                          local_1e40._0_8_ = local_940;
                                          stack0xffffffffffffe1d8 = ZEXT816(8);
                                          local_1c00.m_row = 0;
                                          local_1c00.m_col = 1;
                                          dStack_1e18 = 6.91691904177745e-323;
                                          local_1c00.m_currentBlockRows = 1;
                                          local_1eb8.
                                          super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                          .m_lhs = (type)0x3ff0000000000000;
                                          local_940._0_8_ = local_1ef0;
                                          local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                          local_1c00.m_xpr =
                                               (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                *)local_1e40;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                          local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                          local_1f88.data = (double *)0x0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                          local_1f80 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                          local_1f60 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                          local_1f68 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                          local_1f70 = (DstEvaluatorType *)0x0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                          local_1f78 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                          local_1f50 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                          local_1f58 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f58);
                                          local_1f20 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f20);
                                          local_1f28 = 0.0;
                                          pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f28);
                                          local_1f08 = 0.0;
                                          Eigen::
                                          CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                          ::operator_(pCVar5,&local_1f08);
                                          if ((local_1c00.m_row + local_1c00.m_currentBlockRows == 1
                                              ) && (local_1c00.m_col == 0xe)) {
                                            local_1e40._0_8_ = local_940 + 0x70;
                                            stack0xffffffffffffe1d8 = ZEXT816(9);
                                            local_1c00.m_row = 0;
                                            local_1c00.m_col = 1;
                                            dStack_1e18 = 6.91691904177745e-323;
                                            local_1c00.m_currentBlockRows = 1;
                                            local_940._112_8_ = 0.0;
                                            local_1eb8.
                                            super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                            .m_lhs = (type)0x0;
                                            local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                            local_1c00.m_xpr =
                                                 (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)local_1e40;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1e78);
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1e80);
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ef8);
                                            local_1ee0.m_dst =
                                                 (DstEvaluatorType *)0x3ff0000000000000;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                            local_1f88.data = (double *)0x0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                            local_1f80 = 0.0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                            local_1f60 = 0.0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                            local_1f68 = 0.0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                            local_1f70 = (DstEvaluatorType *)0x0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                            local_1f78 = 0.0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                            local_1f50 = 0.0;
                                            pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                            local_1f58 = 0.0;
                                            Eigen::
                                            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                            ::operator_(pCVar5,&local_1f58);
                                            if ((local_1c00.m_row + local_1c00.m_currentBlockRows ==
                                                 1) && (local_1c00.m_col == 0xe)) {
                                              local_1e40._0_8_ = local_860;
                                              stack0xffffffffffffe1d8 = ZEXT816(10);
                                              local_1c00.m_row = 0;
                                              local_1c00.m_col = 1;
                                              dStack_1e18 = 6.91691904177745e-323;
                                              local_1c00.m_currentBlockRows = 1;
                                              local_860._0_8_ = (PointerType)0x0;
                                              local_1eb8.
                                              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                              .m_lhs = (type)0x0;
                                              local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                              local_1c00.m_xpr =
                                                   (
                                                  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)local_1e40;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                              local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                              local_1f88.data = (double *)0x0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                              local_1f80 = 0.0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                              local_1f60 = 0.0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1e78);
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1e80);
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ef8);
                                              local_1f68 = 1.0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                              local_1f70 = (DstEvaluatorType *)0x0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                              local_1f78 = 0.0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                              local_1f50 = 0.0;
                                              pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                              local_1f58 = 0.0;
                                              Eigen::
                                              CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                              ::operator_(pCVar5,&local_1f58);
                                              if ((local_1c00.m_row + local_1c00.m_currentBlockRows
                                                   == 1) && (local_1c00.m_col == 0xe)) {
                                                local_1e40._0_8_ = local_860 + 0x70;
                                                stack0xffffffffffffe1d8 = ZEXT816(0xb);
                                                local_1c00.m_row = 0;
                                                local_1c00.m_col = 1;
                                                dStack_1e18 = 6.91691904177745e-323;
                                                local_1c00.m_currentBlockRows = 1;
                                                local_860._112_8_ = 0.0;
                                                local_1eb8.
                                                super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                .m_lhs = (type)0x0;
                                                local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                                local_1c00.m_xpr =
                                                     (
                                                  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)local_1e40;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                                local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                                local_1f88.data = (double *)0x0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                                local_1f80 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                                local_1f60 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                                local_1f68 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                                local_1f70 = (DstEvaluatorType *)0x0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                                local_1f78 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                                local_1f50 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                                local_1f58 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f58);
                                                local_1f20 = 0.0;
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f20);
                                                pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ef8);
                                                local_1f28 = 1.0;
                                                Eigen::
                                                CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                ::operator_(pCVar5,&local_1f28);
                                                if ((local_1c00.m_row +
                                                     local_1c00.m_currentBlockRows == 1) &&
                                                   (local_1c00.m_col == 0xe)) {
                                                  local_1e40._0_8_ = local_780;
                                                  stack0xffffffffffffe1d8 = ZEXT816(0xc);
                                                  local_1c00.m_row = 0;
                                                  local_1c00.m_col = 1;
                                                  dStack_1e18 = 6.91691904177745e-323;
                                                  local_1c00.m_currentBlockRows = 1;
                                                  local_780._0_8_ = (PointerType)0x0;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs = (type)0x0;
                                                  local_1e40._16_8_ = (XprTypeNested)local_cc0;
                                                  local_1c00.m_xpr =
                                                       (
                                                  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)local_1e40;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                                  local_1ee0.m_dst = (DstEvaluatorType *)0x0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                                  local_1f88.data = (double *)0x0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                                  local_1f80 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                                  local_1f60 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                                  local_1f68 = (double)local_1e80 * -3.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                                  local_1f70 = (DstEvaluatorType *)
                                                               ((double)local_1ef8 * -2.0);
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                                  local_1f78 = -1.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                                  local_1f50 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                                  local_1f58 = 1.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f58);
                                                  local_1f20 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f20);
                                                  local_1f28 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f28);
                                                  local_1f08 = 0.0;
                                                  Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f08);
                                                  if ((local_1c00.m_row +
                                                       local_1c00.m_currentBlockRows == 1) &&
                                                     (local_1c00.m_col == 0xe)) {
                                                    local_1e40._0_8_ = local_780 + 0x70;
                                                    local_1e40._16_8_ = local_cc0;
                                                    stack0xffffffffffffe1d8 = ZEXT816(0xd);
                                                    local_1c00.m_row = 0;
                                                    local_1c00.m_col = 1;
                                                    dStack_1e18 = 6.91691904177745e-323;
                                                    local_1c00.m_currentBlockRows = 1;
                                                    local_780._112_8_ = 0.0;
                                                    local_1eb8.
                                                                                                        
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs = (type)0x0;
                                                  local_1c00.m_xpr =
                                                       (
                                                  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)local_1e40;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(&local_1c00,(Scalar *)&local_1eb8);
                                                  local_1ee0.m_dst =
                                                       (DstEvaluatorType *)
                                                       ((double)local_1e80 * 3.0);
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1ee0);
                                                  local_1f88.data =
                                                       (double *)
                                                       ((double)local_1ef8 + (double)local_1ef8);
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f88);
                                                  local_1f80 = 1.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f80);
                                                  local_1f60 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f60);
                                                  local_1f68 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f68);
                                                  local_1f70 = (DstEvaluatorType *)0x0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,(Scalar *)&local_1f70);
                                                  local_1f78 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f78);
                                                  local_1f50 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f50);
                                                  local_1f58 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f58);
                                                  local_1f20 = -1.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f20);
                                                  local_1f28 = 0.0;
                                                  pCVar5 = Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f28);
                                                  local_1f08 = 0.0;
                                                  Eigen::
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
                                                  ::operator_(pCVar5,&local_1f08);
                                                  if ((local_1c00.m_row +
                                                       local_1c00.m_currentBlockRows == 1) &&
                                                     (local_1c00.m_col == 0xe)) {
                                                    local_1e40._0_8_ = local_cc0;
                                                    Eigen::internal::
                                                                                                        
                                                  Assignment<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_Eigen::Inverse<Eigen::Matrix<double,_14,_14,_1,_14,_14>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                                                  ::run(&local_6a0,(SrcXprType *)local_1e40,
                                                        (assign_op<double,_double> *)&local_1c00);
                                                  local_1c00.m_xpr = local_1200;
                                                  local_1c00.m_row = (Index)&local_6a0;
                                                  local_1c00.m_col = (Index)local_1980;
                                                  memset((Matrix<double,_6,_12,_1,_6,_12> *)
                                                         local_1e40,0,0x240);
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs = (type)0x3ff0000000000000;
                                                  Eigen::internal::
                                                  generic_product_impl<Eigen::Product<Eigen::Matrix<double,6,14,1,6,14>,Eigen::Matrix<double,14,14,1,14,14>,0>,Eigen::Matrix<double,14,12,1,14,12>,Eigen::DenseShape,Eigen::DenseShape,8>
                                                  ::scaleAndAddTo<Eigen::Matrix<double,6,12,1,6,12>>
                                                            ((Matrix<double,_6,_12,_1,_6,_12> *)
                                                             local_1e40,
                                                             (
                                                  Product<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_Eigen::Matrix<double,_14,_14,_1,_14,_14>,_0>
                                                  *)&local_1c00,
                                                  (Matrix<double,_14,_12,_1,_14,_12> *)local_1980,
                                                  (Scalar *)&local_1eb8);
                                                  local_1c00.m_xpr = local_f60;
                                                  local_1c00.m_row = (Index)&local_6a0;
                                                  local_1980._1344_8_ = local_1e40._0_8_;
                                                  dStack_1438 = (double)local_1e40._8_8_;
                                                  pMStack_1430 = (XprTypeNested)local_1e40._16_8_;
                                                  dStack_1428 = (double)local_1e40._24_8_;
                                                  dStack_1420 = dStack_1e20;
                                                  dStack_1418 = dStack_1e18;
                                                  dStack_1410 = dStack_1e10;
                                                  dStack_1408 = dStack_1e08;
                                                  local_1400 = local_1e00;
                                                  dStack_13f8 = dStack_1df8;
                                                  dStack_13f0 = dStack_1df0;
                                                  dStack_13e8 = dStack_1de8;
                                                  dStack_13e0 = dStack_1de0;
                                                  dStack_13d8 = dStack_1dd8;
                                                  dStack_13d0 = dStack_1dd0;
                                                  dStack_13c8 = dStack_1dc8;
                                                  local_13c0 = local_1dc0;
                                                  dStack_13b8 = dStack_1db8;
                                                  dStack_13b0 = dStack_1db0;
                                                  dStack_13a8 = dStack_1da8;
                                                  dStack_13a0 = dStack_1da0;
                                                  dStack_1398 = dStack_1d98;
                                                  dStack_1390 = dStack_1d90;
                                                  dStack_1388 = dStack_1d88;
                                                  local_1380 = local_1d80;
                                                  dStack_1378 = dStack_1d78;
                                                  dStack_1370 = dStack_1d70;
                                                  dStack_1368 = dStack_1d68;
                                                  dStack_1360 = dStack_1d60;
                                                  dStack_1358 = dStack_1d58;
                                                  dStack_1350 = dStack_1d50;
                                                  dStack_1348 = dStack_1d48;
                                                  local_1340 = local_1d40;
                                                  dStack_1338 = dStack_1d38;
                                                  dStack_1330 = dStack_1d30;
                                                  dStack_1328 = dStack_1d28;
                                                  dStack_1320 = dStack_1d20;
                                                  dStack_1318 = dStack_1d18;
                                                  dStack_1310 = dStack_1d10;
                                                  dStack_1308 = dStack_1d08;
                                                  local_1300 = local_1d00;
                                                  dStack_12f8 = dStack_1cf8;
                                                  dStack_12f0 = dStack_1cf0;
                                                  dStack_12e8 = dStack_1ce8;
                                                  dStack_12e0 = dStack_1ce0;
                                                  dStack_12d8 = dStack_1cd8;
                                                  dStack_12d0 = dStack_1cd0;
                                                  dStack_12c8 = dStack_1cc8;
                                                  local_12c0 = local_1cc0;
                                                  dStack_12b8 = dStack_1cb8;
                                                  dStack_12b0 = dStack_1cb0;
                                                  dStack_12a8 = dStack_1ca8;
                                                  dStack_12a0 = dStack_1ca0;
                                                  dStack_1298 = dStack_1c98;
                                                  dStack_1290 = dStack_1c90;
                                                  dStack_1288 = dStack_1c88;
                                                  local_1280 = local_1c80;
                                                  dStack_1278 = dStack_1c78;
                                                  dStack_1270 = dStack_1c70;
                                                  dStack_1268 = dStack_1c68;
                                                  dStack_1260 = dStack_1c60;
                                                  dStack_1258 = dStack_1c58;
                                                  dStack_1250 = dStack_1c50;
                                                  dStack_1248 = dStack_1c48;
                                                  local_1240 = local_1c40;
                                                  dStack_1238 = dStack_1c38;
                                                  dStack_1230 = dStack_1c30;
                                                  dStack_1228 = dStack_1c28;
                                                  dStack_1220 = dStack_1c20;
                                                  dStack_1218 = dStack_1c18;
                                                  dStack_1210 = dStack_1c10;
                                                  dStack_1208 = dStack_1c08;
                                                  local_1c00.m_col = (Index)local_1980;
                                                  memset((Matrix<double,_6,_12,_1,_6,_12> *)
                                                         local_1e40,0,0x240);
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs = (type)0x3ff0000000000000;
                                                  Eigen::internal::
                                                  generic_product_impl<Eigen::Product<Eigen::Matrix<double,6,14,1,6,14>,Eigen::Matrix<double,14,14,1,14,14>,0>,Eigen::Matrix<double,14,12,1,14,12>,Eigen::DenseShape,Eigen::DenseShape,8>
                                                  ::scaleAndAddTo<Eigen::Matrix<double,6,12,1,6,12>>
                                                            ((Matrix<double,_6,_12,_1,_6,_12> *)
                                                             local_1e40,
                                                             (
                                                  Product<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_Eigen::Matrix<double,_14,_14,_1,_14,_14>,_0>
                                                  *)&local_1c00,
                                                  (Matrix<double,_14,_12,_1,_14,_12> *)local_1980,
                                                  (Scalar *)&local_1eb8);
                                                  uStack_1b00 = 0;
                                                  uStack_1af8 = 0;
                                                  uStack_1af0 = 0;
                                                  uStack_1ae8 = 0;
                                                  local_1bc0 = 0;
                                                  uStack_1bb8 = 0;
                                                  uStack_1bb0 = 0;
                                                  uStack_1ba0 = 0;
                                                  uStack_1b98 = 0;
                                                  uStack_1b90 = 0;
                                                  uStack_1b88 = 0;
                                                  uStack_1b78 = 0;
                                                  uStack_1b70 = 0;
                                                  uStack_1b68 = 0;
                                                  uStack_1b60 = 0;
                                                  uStack_1b58 = 0;
                                                  uStack_1b50 = 0;
                                                  uStack_1b48 = 0;
                                                  uStack_1b40 = 0;
                                                  uStack_1b38 = 0;
                                                  uStack_1b30 = 0;
                                                  uStack_1b28 = 0;
                                                  local_1b20 = 0;
                                                  uStack_1b18 = 0;
                                                  uStack_1b10 = 0;
                                                  uStack_1b08 = 0;
                                                  local_1c00.m_xpr =
                                                       (
                                                  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>
                                                  *)0x0;
                                                  local_1c00.m_row = 0;
                                                  local_1c00.m_col = 0;
                                                  local_1c00.m_currentBlockRows = 0;
                                                  uStack_1be0 = 0;
                                                  uStack_1bd8 = 0;
                                                  uStack_1bd0 = 0;
                                                  uStack_1bc8 = 0;
                                                  uStack_1ba8 = 0xbff0000000000000;
                                                  local_1ee0.m_dst = (DstEvaluatorType *)&local_1f88
                                                  ;
                                                  local_1b80 = 0x3ff0000000000000;
                                                  __src = (type)(local_1980 + 0x540);
                                                  local_1ee0.m_functor =
                                                       (add_assign_op<double,_double> *)&local_1f80;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_innerDim = 6;
                                                  local_1f88.data = (double *)local_1e40;
                                                  local_1ee0.m_src = &local_1eb8;
                                                  local_1ee0.m_dstExpr =
                                                       (Matrix<double,_6,_12,_1,_6,_12> *)local_1e40
                                                  ;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs = (type)&local_1c00;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_rhs = __src;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhsImpl.
                                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                                                  .m_d.data = (
                                                  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                                                  )(
                                                  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                                                  )&local_1c00;
                                                  local_1eb8.
                                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_rhsImpl.
                                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>_>
                                                  .m_d.data = (
                                                  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>_>
                                                  )(
                                                  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>_>
                                                  )__src;
                                                  Eigen::internal::
                                                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_2,_1>
                                                  ::run(&local_1ee0);
                                                  __dest = local_1e60;
                                                  memcpy(&(local_1e60->
                                                                                                                    
                                                  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
                                                  ).
                                                  super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>
                                                  ,__src,0x240);
                                                  memcpy(__dest,(Matrix<double,_6,_12,_1,_6,_12> *)
                                                                local_1e40,0x240);
                                                  return;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          __function = 
                          "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 14, 14, 1>, 1, 14, true>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 14, 14, 1>, 1, 14, true>]"
                          ;
                          goto LAB_0067f20a;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 6, 14, 1>, 1, 14, true>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 6, 14, 1>, 1, 14, true>]"
  ;
LAB_0067f20a:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM(ShapeFunctionGroupFPM& NB, double eta) {
    // The shape functions have referenced two papers below, especially the first one:
    // Alexander R.Stäblein,and Morten H.Hansen.
    // "Timoshenko beam element with anisotropic cross-sectional properties."
    // ECCOMAS Congress 2016, VII European Congress on Computational Methods in Applied Sciences and Engineering.
    // Crete Island, Greece, 5 - 10 June 2016
    //
    // Taeseong Kim, Anders M.Hansen,and Kim Branner.
    // "Development of an anisotropic beam finite element for composite wind turbine blades in multibody system."
    // Renewable Energy 59(2013) : 172 - 183.

    // eta = 2 * x/L;
    // x = (-L/2, L/2),  hence eta = (-1, 1)
    double L = this->length;
    double LL = L * L;
    double LLL = LL * L;
    double eta1 = (eta + 1) / 2.0;
    double eta2 = eta1 * eta1;
    double eta3 = eta2 * eta1;

    ChMatrixNM<double, 6, 14> Ax;
    Ax.setZero();
    ChMatrixNM<double, 6, 14> dAx;
    dAx.setZero();
    ChMatrixNM<double, 14, 14> Ex;
    Ex.setZero();
    ChMatrixNM<double, 14, 14> Ex_inv;
    Ex_inv.setZero();
    ChMatrixNM<double, 6, 12> Nx;
    Nx.setZero();
    ChMatrixNM<double, 6, 12> dNx;
    dNx.setZero();

    // The coefficient matrix of the displacements and rotations with respect to the shape function coefficient vector
    // c_v note: the shape function coefficient vector is as below: c_v = [c1 c2 c3 c4 c5 c6 c7 c8 c9 c10 c13 c14 c11
    // c12].';  // notice the order of c11 c12 c13 c14
    Ax.row(0) << L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ax.row(1) << 0, 0, LLL * eta3, LL * eta2, L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ax.row(2) << 0, 0, 0, 0, 0, 0, LLL * eta3, LL * eta2, L * eta1, 1, 0, 0, 0, 0;
    Ax.row(3) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, L * eta1, 1;
    Ax.row(4) << 0, 0, 0, 0, 0, 0, -3 * LL * eta2, -2 * L * eta1, -1, 0, 1, 0, 0, 0;
    Ax.row(5) << 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;

    // The derivative of Ax
    dAx.row(0) << 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    dAx.row(1) << 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    dAx.row(2) << 0, 0, 0, 0, 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0;
    dAx.row(3) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0;
    dAx.row(4) << 0, 0, 0, 0, 0, 0, -6 * L * eta1, -2, 0, 0, 0, 0, 0, 0;
    dAx.row(5) << 0, 0, 6 * L * eta1, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;

    // A temporary transformation matrix
    ChMatrixNM<double, 14, 12> Ttemp;
    Ttemp.setZero();
    Ttemp.block<12, 12>(2, 0).setIdentity();

    // the cross-sectional material stiffness matrix Klaw along beam element may be variant
    // due to different Klaw at two ends of tapered-sectional beam
    ChMatrixNM<double, 6, 6> Klaw_point = this->tapered_section_fpm->GetKlawAtPoint(eta);
    // double k11 = Klaw_point(0, 0);
    double k12 = Klaw_point(0, 1);
    double k13 = Klaw_point(0, 2);
    // double k14 = Klaw_point(0, 3);
    // double k15 = Klaw_point(0, 4);
    // double k16 = Klaw_point(0, 5);
    double k22 = Klaw_point(1, 1);
    double k23 = Klaw_point(1, 2);
    double k24 = Klaw_point(1, 3);
    double k25 = Klaw_point(1, 4);
    double k26 = Klaw_point(1, 5);
    double k33 = Klaw_point(2, 2);
    double k34 = Klaw_point(2, 3);
    double k35 = Klaw_point(2, 4);
    double k36 = Klaw_point(2, 5);
    // double k44 = Klaw_point(3, 3);
    // double k45 = Klaw_point(3, 4);
    // double k46 = Klaw_point(3, 5);
    double k55 = Klaw_point(4, 4);
    double k56 = Klaw_point(4, 5);
    double k66 = Klaw_point(5, 5);

    // The coefficient matrix of the equilibrium and compatibility equations
    // with respect to the shape function coefficient vector c_v
    Ex.row(0) << -k13, 0, 6 * k56 - 3 * L * k36 - 3 * L * eta * k36, -2 * k36, 0, 0,
        3 * L * k35 - 6 * k55 + 3 * L * eta * k35, 2 * k35, 0, 0, -k33, -k23, -k34, 0;
    Ex.row(1) << k12, 0, 6 * k66 + 3 * L * k26 + 3 * L * eta * k26, 2 * k26, 0, 0,
        -6 * k56 - 3 * L * k25 - 3 * L * eta * k25, -2 * k25, 0, 0, k23, k22, k24, 0;
    Ex.row(2) << 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(3) << 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(4) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0;
    Ex.row(5) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1;
    Ex.row(6) << 0, 0, 0, 0, 0, 0, 0, 0, -1, 0, 1, 0, 0, 0;
    Ex.row(7) << 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;
    Ex.row(8) << L, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(9) << 0, 0, LLL, LL, L, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(10) << 0, 0, 0, 0, 0, 0, LLL, LL, L, 1, 0, 0, 0, 0;
    Ex.row(11) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, L, 1;
    Ex.row(12) << 0, 0, 0, 0, 0, 0, -3 * LL, -2 * L, -1, 0, 1, 0, 0, 0;
    Ex.row(13) << 0, 0, 3 * LL, 2 * L, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;

    // The inverse of Ex
    Ex_inv = Ex.inverse();

    // The shape function matrix at dimensionless position eta
    Nx = Ax * Ex_inv * Ttemp;
    // and its derivative
    dNx = dAx * Ex_inv * Ttemp;  // DO NOT add Ax * dEx_inv * Ttemp, see the first paper please.

    // A temporary matrix
    ChMatrixNM<double, 6, 6> TNtemp;
    TNtemp.setZero();
    TNtemp(1, 5) = -1.0;
    TNtemp(2, 4) = 1.0;

    // The strain displacement matrix at dimensionless position eta
    ChMatrixNM<double, 6, 12> Bx = dNx + TNtemp * Nx;

    // return result
    NB = std::make_tuple(Nx, Bx);
}